

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contract_light_test.cpp
# Opt level: O0

void __thiscall
ContractTestOnClassWithInvariant_ThatACallToAFailingPreconditionFireTheSetExceptionAndThatTheInvariantWasCalledAndThatTheStateOfTheClassDoesNotChange_Test
::TestBody(ContractTestOnClassWithInvariant_ThatACallToAFailingPreconditionFireTheSetExceptionAndThatTheInvariantWasCalledAndThatTheStateOfTheClassDoesNotChange_Test
           *this)

{
  bool bVar1;
  undefined1 uVar2;
  AssertHelper *this_00;
  char *in_RDI;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  PreConditionFailedEx *anon_var_0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  int oldY;
  int oldX;
  undefined7 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5f;
  AssertionResult *in_stack_fffffffffffffe60;
  int *in_stack_fffffffffffffe68;
  AssertionResult *this_01;
  undefined7 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe77;
  char *in_stack_fffffffffffffe78;
  int line;
  char *in_stack_fffffffffffffe80;
  AssertionResult *this_02;
  Type in_stack_fffffffffffffe8c;
  Type type;
  AssertHelper *in_stack_fffffffffffffe90;
  AssertionResult *this_03;
  undefined6 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  char *in_stack_fffffffffffffed0;
  AssertionResult *in_stack_fffffffffffffed8;
  AssertHelper *in_stack_fffffffffffffee0;
  int in_stack_ffffffffffffff0c;
  TestClassWithInvariant *in_stack_ffffffffffffff10;
  AssertionResult local_c0;
  string local_b0 [48];
  AssertionResult local_80 [2];
  undefined4 local_5c;
  AssertionResult local_58 [3];
  byte local_19;
  ConstCharPtr local_18;
  undefined4 local_10;
  undefined4 local_c;
  
  local_c = *(undefined4 *)(in_RDI + 0x10);
  local_10 = *(undefined4 *)(in_RDI + 0x14);
  testing::internal::ConstCharPtr::ConstCharPtr(&local_18,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool(&local_18);
  if (bVar1) {
    local_19 = 0;
    in_stack_fffffffffffffec7 = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffffec7) {
      anon_unknown.dwarf_114b::TestClassWithInvariant::setX
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
    }
    if ((local_19 & 1) != 0) goto LAB_0013f76a;
    local_18.value =
         "Expected: sut.setX(0) throws an exception of type PreConditionFailedEx.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message((Message *)in_stack_fffffffffffffe90);
  testing::internal::AssertHelper::AssertHelper
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,in_stack_fffffffffffffe80,
             (int)((ulong)in_stack_fffffffffffffe78 >> 0x20),
             (char *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
  testing::internal::AssertHelper::operator=
            (in_stack_fffffffffffffee0,(Message *)in_stack_fffffffffffffed8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe60);
  testing::Message::~Message((Message *)0x13f71f);
LAB_0013f76a:
  local_5c = 0;
  testing::internal::EqHelper<true>::Compare<int,int>
            (in_stack_fffffffffffffe78,
             (char *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
             in_stack_fffffffffffffe68,(int *)in_stack_fffffffffffffe60,
             (type *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_58);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe90);
    testing::AssertionResult::failure_message((AssertionResult *)0x13f7ff);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,in_stack_fffffffffffffe80,
               (int)((ulong)in_stack_fffffffffffffe78 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffee0,(Message *)in_stack_fffffffffffffed8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe60);
    testing::Message::~Message((Message *)0x13f85c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13f8b1);
  testing::AssertionResult::AssertionResult
            (in_stack_fffffffffffffe60,(bool)in_stack_fffffffffffffe5f);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_80);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,in_RDI,
               (char *)CONCAT17(in_stack_fffffffffffffec7,CONCAT16(uVar2,in_stack_fffffffffffffec0))
              );
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,in_stack_fffffffffffffe80,
               (int)((ulong)in_stack_fffffffffffffe78 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffee0,(Message *)in_stack_fffffffffffffed8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe60);
    std::__cxx11::string::~string(local_b0);
    testing::Message::~Message((Message *)0x13f9c2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13fa3a);
  this_03 = &local_c0;
  testing::AssertionResult::AssertionResult
            (in_stack_fffffffffffffe60,(bool)in_stack_fffffffffffffe5f);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_03);
  if (!bVar1) {
    testing::Message::Message((Message *)this_03);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,in_RDI,
               (char *)CONCAT17(in_stack_fffffffffffffec7,CONCAT16(uVar2,in_stack_fffffffffffffec0))
              );
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_03,in_stack_fffffffffffffe8c,in_stack_fffffffffffffe80,
               (int)((ulong)in_stack_fffffffffffffe78 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffee0,(Message *)in_stack_fffffffffffffed8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe60);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff10);
    testing::Message::~Message((Message *)0x13fb4f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13fbc7);
  this_02 = (AssertionResult *)&stack0xffffffffffffff00;
  testing::internal::EqHelper<false>::Compare<int,int>
            (in_stack_fffffffffffffe78,
             (char *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
             in_stack_fffffffffffffe68,(int *)in_stack_fffffffffffffe60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_02);
  type = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe8c);
  if (!bVar1) {
    testing::Message::Message((Message *)this_03);
    in_stack_fffffffffffffe78 =
         testing::AssertionResult::failure_message((AssertionResult *)0x13fc5e);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_03,type,&this_02->success_,
               (int)((ulong)in_stack_fffffffffffffe78 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffee0,(Message *)in_stack_fffffffffffffed8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe60);
    testing::Message::~Message((Message *)0x13fcbb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13fd10);
  this_01 = (AssertionResult *)&stack0xfffffffffffffee0;
  testing::internal::EqHelper<false>::Compare<int,int>
            (in_stack_fffffffffffffe78,
             (char *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),(int *)this_01,
             (int *)in_stack_fffffffffffffe60);
  line = (int)((ulong)in_stack_fffffffffffffe78 >> 0x20);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(this_01);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)this_03);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x13fda7)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_03,type,&this_02->success_,line,
               (char *)CONCAT17(uVar2,in_stack_fffffffffffffe70));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffee0,(Message *)in_stack_fffffffffffffed8);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x13fdfb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13fe4d);
  return;
}

Assistant:

TEST_F(ContractTestOnClassWithInvariant, ThatACallToAFailingPreconditionFireTheSetExceptionAndThatTheInvariantWasCalledAndThatTheStateOfTheClassDoesNotChange)
{
  auto oldX = sut.x;
  auto oldY = sut.y;
  EXPECT_THROW(sut.setX(0), PreConditionFailedEx);
  
  EXPECT_EQ(0, sut.invariantWasCalled);
  EXPECT_TRUE(sut.preConditionWasCalled);
  EXPECT_FALSE(sut.postConditionWasCalled);

  EXPECT_EQ(oldX, sut.x);
  EXPECT_EQ(oldY, sut.y);
}